

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O2

void __thiscall
enact::FunctionStmt::FunctionStmt
          (FunctionStmt *this,Token *name,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *returnTypename,
          vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *params,
          unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body)

{
  pointer pPVar1;
  
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__FunctionStmt_00123fb8;
  Token::Token(&this->name,name);
  (this->returnTypename)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (returnTypename->_M_t).
       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
       super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  (returnTypename->_M_t).
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  pPVar1 = (params->
           super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->params).
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (params->
       super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->params).
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
  _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  (this->params).
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (params->
       super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (params->
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (params->
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (params->
  super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->body)._M_t.super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>.
  _M_t.super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
  super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl =
       (body->_M_t).super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>.
       _M_t.super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
       super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (body->_M_t).super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
  super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
  super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl = (BlockExpr *)0x0;
  return;
}

Assistant:

FunctionStmt(Token name, std::unique_ptr<const Typename> returnTypename, std::vector<Param> &&params,
                     std::unique_ptr<BlockExpr> body) :
                name{std::move(name)},
                returnTypename{std::move(returnTypename)},
                params{std::move(params)},
                body{std::move(body)} {}